

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_impl.cpp
# Opt level: O2

MPP_RET mpp_ops_ctrl(MppDump info,MpiCmd cmd)

{
  MppDumpImpl *p;
  AutoMutex auto_lock;
  Autolock local_20;
  
  if (info != (MppDump)0x0) {
    local_20.mLock = *info;
    local_20.mEnabled = 1;
    if ((pthread_mutex_t *)local_20.mLock != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock((pthread_mutex_t *)local_20.mLock);
    }
    if (*(FILE **)((long)info + 0x38) != (FILE *)0x0) {
      _ops_log(*(FILE **)((long)info + 0x38),"%d,%s,%d\n",(ulong)*(uint *)((long)info + 0x58),"ctrl"
               ,cmd);
    }
    Mutex::Autolock::~Autolock(&local_20);
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_ops_ctrl(MppDump info, MpiCmd cmd)
{
    MppDumpImpl *p = (MppDumpImpl *)info;
    if (NULL == p)
        return MPP_OK;

    AutoMutex auto_lock(p->lock);

    if (p->fp_ops)
        ops_log(p->fp_ops, "%d,%s,%d\n", p->idx, "ctrl", cmd);

    return MPP_OK;
}